

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool dummy [4];
  bool at_end;
  bool local_51;
  ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *in_stack_ffffffffffffffb8;
  ParamIterator<int> *other;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar1;
  bool local_21;
  undefined8 local_b;
  
  local_b._2_1_ = 0;
  std::
  get<0ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              *)0x6537e3);
  std::
  get<0ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              *)0x6537f6);
  local_b._2_1_ =
       ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::operator==
                 ((ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
                  CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  local_21 = true;
  if (!(bool)local_b._2_1_) {
    std::
    get<1ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x653843);
    std::
    get<1ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x653856);
    local_21 = ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::operator==
                         ((ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
  }
  local_b._2_1_ = local_21;
  other = (ParamIterator<int> *)&local_b;
  uVar1 = true;
  if (local_21 == false) {
    std::
    get<2ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x6538a7);
    std::
    get<2ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x6538ba);
    uVar1 = ParamIterator<int>::operator==
                      ((ParamIterator<int> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),other);
  }
  local_b._2_1_ = uVar1;
  *(undefined1 *)
   &(other->impl_)._M_t.
    super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
    .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       uVar1;
  local_51 = true;
  if ((local_b._2_1_ & 1) == 0) {
    std::
    get<3ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x65390b);
    std::
    get<3ul,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<double(*)(unsigned_char_const*,int,int,int,int)>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                *)0x65391d);
    local_51 = ParamIterator<int>::operator==
                         ((ParamIterator<int> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),other);
  }
  return local_51;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }